

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O2

void av1_highbd_warp_affine_sse4_1
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int offset_bits_horiz;
  longlong *plVar1;
  __m128i alVar2;
  WarpedFilterCoeff aWVar3 [8];
  WarpedFilterCoeff aWVar4 [8];
  __m128i alVar5;
  int reduce_bits_horiz;
  int iVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int alpha_00;
  long lVar15;
  long lVar16;
  __m128i *palVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint16_t *puVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  short sVar41;
  int iVar42;
  short sVar53;
  short sVar54;
  int iVar55;
  short sVar56;
  int iVar57;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar46;
  __m128i alVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ushort uVar59;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar74;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  int iVar90;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int local_368;
  int local_350;
  __m128i src_1;
  __m128i src2;
  __m128i src;
  short local_148;
  short sStack_146;
  __m128i tmp [15];
  short sVar60;
  short sVar75;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  
  reduce_bits_horiz = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar29 = 0xe - reduce_bits_horiz;
    uVar30 = conv_params->round_1;
  }
  else {
    uVar30 = conv_params->round_1;
    uVar29 = uVar30;
  }
  bVar9 = (byte)reduce_bits_horiz;
  bVar8 = (byte)bd;
  uVar37 = 0xff;
  if (bd == 0xc) {
    uVar37 = 0xfff;
  }
  uVar26 = 0x3ff;
  if (bd != 10) {
    uVar26 = uVar37;
  }
  bVar18 = (bVar8 + 0xe) - (char)(uVar30 + reduce_bits_horiz);
  iVar38 = (1 << ((byte)uVar29 & 0x1f)) >> 1;
  uVar30 = 0xe - (uVar30 + reduce_bits_horiz);
  auVar118 = ZEXT416(uVar30);
  alpha_00 = (int)alpha;
  iVar31 = (int)beta;
  iVar27 = (int)gamma;
  iVar36 = 1 << ((bVar9 ^ 0xff) + bVar8 + 7 & 0x1f);
  iVar39 = (1 << ((bVar8 + 0xe) - bVar9 & 0x1f)) + iVar38;
  iVar34 = ((1 << ((byte)uVar30 & 0x1f)) >> 1) +
           (-1 << (bVar18 - 1 & 0x1f)) + (-1 << (bVar18 & 0x1f));
  auVar119 = ZEXT416(uVar29);
  iVar38 = (-1 << (((byte)uVar29 + bVar8) - 1 & 0x1f)) + iVar38;
  offset_bits_horiz = bd + 6;
  auVar43 = pshuflw(ZEXT416(uVar26),ZEXT416(uVar26),0);
  iVar6 = conv_params->fwd_offset;
  iVar7 = conv_params->bck_offset;
  auVar44 = ZEXT416(-1 << (bVar8 & 0x1f) ^ 0xffffffff);
  iVar19 = iVar31 * -3 + 0x10200;
  auVar44 = pshuflw(auVar44,auVar44,0);
  iVar23 = height + -1;
  local_368 = 0;
  for (iVar22 = 0; iVar24 = p_height - iVar22, iVar24 != 0 && iVar22 <= p_height;
      iVar22 = iVar22 + 8) {
    lVar15 = (long)(p_row + 4 + iVar22 << ((byte)subsampling_y & 0x1f));
    if (7 < iVar24) {
      iVar24 = 8;
    }
    local_350 = local_368;
    for (iVar21 = 0; iVar21 < p_width; iVar21 = iVar21 + 8) {
      lVar16 = (long)(p_col + 4 + iVar21 << ((byte)subsampling_x & 0x1f));
      lVar40 = (long)*mat + mat[3] * lVar15 + mat[2] * lVar16 >> ((byte)subsampling_x & 0x3f);
      lVar16 = (long)mat[1] + mat[5] * lVar15 + mat[4] * lVar16 >> ((byte)subsampling_y & 0x3f);
      iVar20 = (int)((ulong)lVar40 >> 0x10);
      iVar25 = (int)((ulong)lVar16 >> 0x10);
      if (iVar20 < -6) {
        palVar17 = tmp;
        for (lVar40 = -7; lVar40 < iVar24; lVar40 = lVar40 + 1) {
          iVar20 = (int)lVar40 + iVar25;
          if ((long)height <= iVar25 + lVar40) {
            iVar20 = iVar23;
          }
          if (iVar25 + lVar40 < 0) {
            iVar20 = 0;
          }
          auVar45 = ZEXT416(((uint)ref[iVar20 * stride] << (7 - bVar9 & 0x1f)) + iVar36);
          auVar45 = pshuflw(auVar45,auVar45,0);
          alVar46[0]._0_4_ = auVar45._0_4_;
          alVar46[0]._4_4_ = (undefined4)alVar46[0];
          alVar46[1]._0_4_ = (undefined4)alVar46[0];
          alVar46[1]._4_4_ = (undefined4)alVar46[0];
          *palVar17 = alVar46;
          palVar17 = palVar17 + 1;
        }
      }
      else if (iVar20 < width + 6) {
        uVar30 = ((uint)lVar40 & 0xfffc) + (iVar31 + alpha_00) * -4 & 0xffffffc0;
        if (width < iVar20 + 9 || iVar20 < 7) {
          uVar29 = (iVar20 - width) + 8;
          iVar32 = uVar30 + iVar19;
          for (iVar28 = -7; iVar28 < iVar24; iVar28 = iVar28 + 1) {
            iVar42 = iVar28 + iVar25;
            iVar33 = iVar23;
            if (iVar42 < height) {
              iVar33 = iVar42;
            }
            if (iVar42 < 0) {
              iVar33 = 0;
            }
            auVar45 = pshufb(*(undefined1 (*) [16])
                              (ref + (long)iVar20 + (long)(iVar33 * stride) + -7),_DAT_00468e70);
            auVar106 = pshufb(*(undefined1 (*) [16])
                               (ref + (long)iVar20 + (long)(iVar33 * stride) + 1),_DAT_00468e70);
            auVar115._0_8_ = auVar45._0_8_;
            auVar115._8_8_ = auVar106._0_8_;
            auVar106._8_8_ = auVar106._8_8_;
            auVar106._0_8_ = auVar45._8_8_;
            if (iVar20 < 7) {
              auVar115 = pshufb(auVar115,(undefined1  [16])warp_pad_left[6 - iVar20]);
              auVar106 = pshufb(auVar106,(undefined1  [16])warp_pad_left[6 - iVar20]);
            }
            if (-1 < (int)uVar29) {
              auVar115 = pshufb(auVar115,(undefined1  [16])warp_pad_right[uVar29]);
              auVar106 = pshufb(auVar106,(undefined1  [16])warp_pad_right[uVar29]);
            }
            auVar80._0_14_ = auVar115._0_14_;
            auVar80[0xe] = auVar115[7];
            auVar80[0xf] = auVar106[7];
            auVar79._14_2_ = auVar80._14_2_;
            auVar79._0_13_ = auVar115._0_13_;
            auVar79[0xd] = auVar106[6];
            auVar117._13_3_ = auVar79._13_3_;
            auVar117._0_12_ = auVar115._0_12_;
            auVar117[0xc] = auVar115[6];
            auVar45._12_4_ = auVar117._12_4_;
            auVar45._0_11_ = auVar115._0_11_;
            auVar45[0xb] = auVar106[5];
            auVar78._11_5_ = auVar45._11_5_;
            auVar78._0_10_ = auVar115._0_10_;
            auVar78[10] = auVar115[5];
            auVar77._10_6_ = auVar78._10_6_;
            auVar77._0_9_ = auVar115._0_9_;
            auVar77[9] = auVar106[4];
            auVar76._9_7_ = auVar77._9_7_;
            auVar76._0_8_ = auVar115._0_8_;
            auVar76[8] = auVar115[4];
            src[1] = auVar76._8_8_;
            src[0]._7_1_ = auVar106[3];
            src[0]._6_1_ = auVar115[3];
            src[0]._5_1_ = auVar106[2];
            src[0]._4_1_ = auVar115[2];
            src[0]._3_1_ = auVar106[1];
            src[0]._2_1_ = auVar115[1];
            src[0]._0_1_ = auVar115[0];
            src[0]._1_1_ = auVar106[0];
            src_1[0]._1_1_ = auVar106[8];
            src_1[0]._0_1_ = auVar115[8];
            src_1[0]._2_1_ = auVar115[9];
            src_1[0]._3_1_ = auVar106[9];
            src_1[0]._4_1_ = auVar115[10];
            src_1[0]._5_1_ = auVar106[10];
            src_1[0]._6_1_ = auVar115[0xb];
            src_1[0]._7_1_ = auVar106[0xb];
            src_1[1]._0_1_ = auVar115[0xc];
            src_1[1]._1_1_ = auVar106[0xc];
            src_1[1]._2_1_ = auVar115[0xd];
            src_1[1]._3_1_ = auVar106[0xd];
            src_1[1]._4_1_ = auVar115[0xe];
            src_1[1]._5_1_ = auVar106[0xe];
            src_1[1]._6_1_ = auVar115[0xf];
            src_1[1]._7_1_ = auVar106[0xf];
            highbd_horiz_filter(&src,&src_1,tmp,iVar32,alpha_00,iVar28,offset_bits_horiz,
                                reduce_bits_horiz);
            iVar32 = iVar32 + iVar31;
          }
        }
        else if (beta == 0 && alpha == 0) {
          uVar10 = *(undefined4 *)
                    ((long)av1_warped_filter[0] + (ulong)(uVar30 + 0x10200 >> 6 & 0xfffffff0));
          src[0]._4_4_ = uVar10;
          src[0]._0_4_ = uVar10;
          src[1]._0_4_ = uVar10;
          src[1]._4_4_ = uVar10;
          for (iVar28 = -7; iVar28 < iVar24; iVar28 = iVar28 + 1) {
            iVar33 = iVar28 + iVar25;
            iVar32 = iVar23;
            if (iVar33 < height) {
              iVar32 = iVar33;
            }
            if (iVar33 < 0) {
              iVar32 = 0;
            }
            src_1 = *(__m128i *)
                     ((long)ref + (long)(iVar32 * stride) * 2 + ((ulong)(uint)(iVar20 * 2) - 0xe));
            plVar1 = (longlong *)
                     ((long)ref + (long)(iVar32 * stride) * 2 + (ulong)(uint)(iVar20 * 2) + 2);
            src2[0] = *plVar1;
            src2[1] = plVar1[1];
            highbd_filter_src_pixels
                      (&src_1,&src2,tmp,&src,offset_bits_horiz,reduce_bits_horiz,iVar28);
          }
        }
        else if (alpha != 0 || beta == 0) {
          if (alpha != 0 && beta == 0) {
            highbd_prepare_horizontal_filter_coeff(alpha_00,uVar30 + 0x10200,&src);
            for (iVar28 = -7; iVar28 < iVar24; iVar28 = iVar28 + 1) {
              iVar33 = iVar28 + iVar25;
              iVar32 = iVar23;
              if (iVar33 < height) {
                iVar32 = iVar33;
              }
              if (iVar33 < 0) {
                iVar32 = 0;
              }
              src_1 = *(__m128i *)
                       ((long)ref + (long)(iVar32 * stride) * 2 + ((ulong)(uint)(iVar20 * 2) - 0xe))
              ;
              plVar1 = (longlong *)
                       ((long)ref + (long)(iVar32 * stride) * 2 + (ulong)(uint)(iVar20 * 2) + 2);
              src2[0] = *plVar1;
              src2[1] = plVar1[1];
              highbd_filter_src_pixels
                        (&src_1,&src2,tmp,&src,offset_bits_horiz,reduce_bits_horiz,iVar28);
            }
          }
          else {
            iVar32 = uVar30 + iVar19;
            for (iVar28 = -7; iVar28 < iVar24; iVar28 = iVar28 + 1) {
              iVar42 = iVar28 + iVar25;
              iVar33 = iVar23;
              if (iVar42 < height) {
                iVar33 = iVar42;
              }
              if (iVar42 < 0) {
                iVar33 = 0;
              }
              src = *(__m128i *)
                     ((long)ref + (long)(iVar33 * stride) * 2 + ((ulong)(uint)(iVar20 * 2) - 0xe));
              src_1 = *(__m128i *)
                       ((long)ref + (long)(iVar33 * stride) * 2 + (ulong)(uint)(iVar20 * 2) + 2);
              highbd_horiz_filter(&src,&src_1,tmp,iVar32,alpha_00,iVar28,offset_bits_horiz,
                                  reduce_bits_horiz);
              iVar32 = iVar32 + iVar31;
            }
          }
        }
        else {
          iVar32 = uVar30 + iVar19;
          for (iVar28 = -7; iVar28 < iVar24; iVar28 = iVar28 + 1) {
            iVar42 = iVar28 + iVar25;
            iVar33 = iVar23;
            if (iVar42 < height) {
              iVar33 = iVar42;
            }
            if (iVar42 < 0) {
              iVar33 = 0;
            }
            src_1 = *(__m128i *)
                     ((long)ref + (long)(iVar33 * stride) * 2 + ((ulong)(uint)(iVar20 * 2) - 0xe));
            plVar1 = (longlong *)
                     ((long)ref + (long)(iVar33 * stride) * 2 + (ulong)(uint)(iVar20 * 2) + 2);
            src2[0] = *plVar1;
            src2[1] = plVar1[1];
            uVar10 = *(undefined4 *)av1_warped_filter[iVar32 >> 10];
            src[0]._4_4_ = uVar10;
            src[0]._0_4_ = uVar10;
            src[1]._0_4_ = uVar10;
            src[1]._4_4_ = uVar10;
            highbd_filter_src_pixels
                      (&src_1,&src2,tmp,&src,offset_bits_horiz,reduce_bits_horiz,iVar28);
            iVar32 = iVar32 + iVar31;
          }
        }
      }
      else {
        palVar17 = tmp;
        for (lVar40 = -7; lVar40 < iVar24; lVar40 = lVar40 + 1) {
          iVar20 = (int)lVar40 + iVar25;
          if ((long)height <= iVar25 + lVar40) {
            iVar20 = iVar23;
          }
          if (iVar25 + lVar40 < 0) {
            iVar20 = 0;
          }
          auVar45 = ZEXT416(((uint)ref[iVar20 * stride + width + -1] << (7 - bVar9 & 0x1f)) + iVar36
                           );
          auVar45 = pshuflw(auVar45,auVar45,0);
          alVar47[0]._0_4_ = auVar45._0_4_;
          alVar47[0]._4_4_ = (undefined4)alVar47[0];
          alVar47[1]._0_4_ = (undefined4)alVar47[0];
          alVar47[1]._4_4_ = (undefined4)alVar47[0];
          *palVar17 = alVar47;
          palVar17 = palVar17 + 1;
        }
      }
      iVar28 = (((uint)lVar16 & 0xfffc) + (delta + iVar27) * -4 & 0xffffffc0) + 0x10200;
      palVar17 = tmp + 7;
      iVar25 = local_350;
      iVar20 = iVar22;
      for (lVar16 = -4; lVar16 < iVar24 + -4; lVar16 = lVar16 + 1) {
        alVar47 = palVar17[-7];
        alVar46 = palVar17[-5];
        auVar96._0_12_ = alVar47._0_12_;
        auVar96._12_2_ = alVar47[0]._6_2_;
        auVar96._14_2_ = *(undefined2 *)((long)palVar17[-6] + 6);
        auVar95._12_4_ = auVar96._12_4_;
        auVar95._0_10_ = alVar47._0_10_;
        auVar95._10_2_ = *(undefined2 *)((long)palVar17[-6] + 4);
        auVar94._10_6_ = auVar95._10_6_;
        auVar94._0_8_ = alVar47[0];
        auVar94._8_2_ = alVar47[0]._4_2_;
        auVar93._8_8_ = auVar94._8_8_;
        auVar93._6_2_ = *(undefined2 *)((long)palVar17[-6] + 2);
        auVar93._4_2_ = alVar47[0]._2_2_;
        auVar93._0_2_ = (undefined2)alVar47[0];
        auVar93._2_2_ = (short)palVar17[-6][0];
        auVar86._0_12_ = alVar46._0_12_;
        auVar86._12_2_ = alVar46[0]._6_2_;
        auVar86._14_2_ = *(undefined2 *)((long)palVar17[-4] + 6);
        auVar85._12_4_ = auVar86._12_4_;
        auVar85._0_10_ = alVar46._0_10_;
        auVar85._10_2_ = *(undefined2 *)((long)palVar17[-4] + 4);
        auVar84._10_6_ = auVar85._10_6_;
        auVar84._0_8_ = alVar46[0];
        auVar84._8_2_ = alVar46[0]._4_2_;
        auVar83._8_8_ = auVar84._8_8_;
        auVar83._6_2_ = *(undefined2 *)((long)palVar17[-4] + 2);
        auVar83._4_2_ = alVar46[0]._2_2_;
        auVar83._0_2_ = (undefined2)alVar46[0];
        auVar83._2_2_ = (short)palVar17[-4][0];
        alVar2 = palVar17[-3];
        aWVar3 = av1_warped_filter[iVar28 >> 10];
        iVar32 = iVar27 * 2 + iVar28 >> 10;
        aWVar4 = av1_warped_filter[iVar27 * 4 + iVar28 >> 10];
        iVar33 = iVar27 * 6 + iVar28 >> 10;
        auVar104._0_8_ = aWVar3._0_8_;
        auVar104._8_4_ = aWVar3._4_4_;
        auVar104._12_4_ = *(undefined4 *)(av1_warped_filter[iVar32] + 2);
        auVar114._4_4_ = *(undefined4 *)av1_warped_filter[iVar32];
        auVar114._0_4_ = aWVar3._0_4_;
        auVar48._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar32] + 4),aWVar3._8_4_);
        auVar48._8_4_ = aWVar3._12_4_;
        auVar48._12_4_ = *(undefined4 *)(av1_warped_filter[iVar32] + 6);
        auVar109._0_8_ = aWVar4._0_8_;
        auVar109._8_4_ = aWVar4._4_4_;
        auVar109._12_4_ = *(undefined4 *)(av1_warped_filter[iVar33] + 2);
        auVar114._12_4_ = *(undefined4 *)av1_warped_filter[iVar33];
        auVar114._8_4_ = aWVar4._0_4_;
        auVar98._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar33] + 4),aWVar4._8_4_);
        auVar98._8_4_ = aWVar4._12_4_;
        auVar98._12_4_ = *(undefined4 *)(av1_warped_filter[iVar33] + 6);
        auVar115 = pmaddwd(auVar114,auVar93);
        auVar105._8_8_ = auVar109._8_8_;
        auVar105._0_8_ = auVar104._8_8_;
        auVar113._0_12_ = alVar2._0_12_;
        auVar113._12_2_ = alVar2[0]._6_2_;
        auVar113._14_2_ = *(undefined2 *)((long)palVar17[-2] + 6);
        auVar112._12_4_ = auVar113._12_4_;
        auVar112._0_10_ = alVar2._0_10_;
        auVar112._10_2_ = *(undefined2 *)((long)palVar17[-2] + 4);
        auVar111._10_6_ = auVar112._10_6_;
        auVar111._0_8_ = alVar2[0];
        auVar111._8_2_ = alVar2[0]._4_2_;
        auVar110._8_8_ = auVar111._8_8_;
        auVar110._6_2_ = *(undefined2 *)((long)palVar17[-2] + 2);
        auVar110._4_2_ = alVar2[0]._2_2_;
        auVar110._0_2_ = (undefined2)alVar2[0];
        auVar110._2_2_ = (short)palVar17[-2][0];
        auVar106 = pmaddwd(auVar105,auVar83);
        alVar5 = palVar17[-1];
        auVar116._8_8_ = auVar98._0_8_;
        auVar116._0_8_ = auVar48._0_8_;
        auVar117 = pmaddwd(auVar116,auVar110);
        auVar49._8_8_ = auVar98._8_8_;
        auVar49._0_8_ = auVar48._8_8_;
        auVar102._0_12_ = alVar5._0_12_;
        auVar102._12_2_ = alVar5[0]._6_2_;
        auVar102._14_2_ = *(undefined2 *)((long)*palVar17 + 6);
        auVar101._12_4_ = auVar102._12_4_;
        auVar101._0_10_ = alVar5._0_10_;
        auVar101._10_2_ = *(undefined2 *)((long)*palVar17 + 4);
        auVar100._10_6_ = auVar101._10_6_;
        auVar100._0_8_ = alVar5[0];
        auVar100._8_2_ = alVar5[0]._4_2_;
        auVar99._8_8_ = auVar100._8_8_;
        auVar99._6_2_ = *(undefined2 *)((long)*palVar17 + 2);
        auVar99._4_2_ = alVar5[0]._2_2_;
        auVar99._0_2_ = (undefined2)alVar5[0];
        auVar99._2_2_ = (short)(*palVar17)[0];
        auVar45 = pmaddwd(auVar49,auVar99);
        iVar42 = auVar45._0_4_ + auVar117._0_4_ + auVar106._0_4_ + auVar115._0_4_;
        iVar55 = auVar45._4_4_ + auVar117._4_4_ + auVar106._4_4_ + auVar115._4_4_;
        iVar57 = auVar45._8_4_ + auVar117._8_4_ + auVar106._8_4_ + auVar115._8_4_;
        iVar58 = auVar45._12_4_ + auVar117._12_4_ + auVar106._12_4_ + auVar115._12_4_;
        auVar82._2_2_ = (short)palVar17[-6][1];
        auVar82._0_2_ = (short)alVar47[1];
        auVar82._4_2_ = alVar47[1]._2_2_;
        auVar82._6_2_ = *(undefined2 *)((long)palVar17[-6] + 10);
        auVar82._8_2_ = alVar47[1]._4_2_;
        auVar82._10_2_ = *(undefined2 *)((long)palVar17[-6] + 0xc);
        auVar82._12_2_ = alVar47[1]._6_2_;
        auVar82._14_2_ = *(undefined2 *)((long)palVar17[-6] + 0xe);
        auVar61._2_2_ = (short)palVar17[-4][1];
        auVar61._0_2_ = (short)alVar46[1];
        auVar61._4_2_ = alVar46[1]._2_2_;
        auVar61._6_2_ = *(undefined2 *)((long)palVar17[-4] + 10);
        auVar61._8_2_ = alVar46[1]._4_2_;
        auVar61._10_2_ = *(undefined2 *)((long)palVar17[-4] + 0xc);
        auVar61._12_2_ = alVar46[1]._6_2_;
        auVar61._14_2_ = *(undefined2 *)((long)palVar17[-4] + 0xe);
        auVar81._2_2_ = (short)palVar17[-2][1];
        auVar81._0_2_ = (short)alVar2[1];
        auVar81._4_2_ = alVar2[1]._2_2_;
        auVar81._6_2_ = *(undefined2 *)((long)palVar17[-2] + 10);
        auVar81._8_2_ = alVar2[1]._4_2_;
        auVar81._10_2_ = *(undefined2 *)((long)palVar17[-2] + 0xc);
        auVar81._12_2_ = alVar2[1]._6_2_;
        auVar81._14_2_ = *(undefined2 *)((long)palVar17[-2] + 0xe);
        auVar87._2_2_ = (short)(*palVar17)[1];
        auVar87._0_2_ = (short)alVar5[1];
        auVar87._4_2_ = alVar5[1]._2_2_;
        auVar87._6_2_ = *(undefined2 *)((long)*palVar17 + 10);
        auVar87._8_2_ = alVar5[1]._4_2_;
        auVar87._10_2_ = *(undefined2 *)((long)*palVar17 + 0xc);
        auVar87._12_2_ = alVar5[1]._6_2_;
        auVar87._14_2_ = *(undefined2 *)((long)*palVar17 + 0xe);
        aWVar3 = av1_warped_filter[iVar27 + iVar28 >> 10];
        iVar32 = iVar27 * 3 + iVar28 >> 10;
        aWVar4 = av1_warped_filter[iVar27 * 5 + iVar28 >> 10];
        iVar33 = iVar27 * 7 + iVar28 >> 10;
        auVar107._0_8_ = aWVar3._0_8_;
        auVar107._8_4_ = aWVar3._4_4_;
        auVar107._12_4_ = *(undefined4 *)(av1_warped_filter[iVar32] + 2);
        auVar103._4_4_ = *(undefined4 *)av1_warped_filter[iVar32];
        auVar103._0_4_ = aWVar3._0_4_;
        auVar88._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar32] + 4),aWVar3._8_4_);
        auVar88._8_4_ = aWVar3._12_4_;
        auVar88._12_4_ = *(undefined4 *)(av1_warped_filter[iVar32] + 6);
        auVar97._0_8_ = aWVar4._0_8_;
        auVar97._8_4_ = aWVar4._4_4_;
        auVar97._12_4_ = *(undefined4 *)(av1_warped_filter[iVar33] + 2);
        auVar103._12_4_ = *(undefined4 *)av1_warped_filter[iVar33];
        auVar103._8_4_ = aWVar4._0_4_;
        auVar92._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar33] + 4),aWVar4._8_4_);
        auVar92._8_4_ = aWVar4._12_4_;
        auVar92._12_4_ = *(undefined4 *)(av1_warped_filter[iVar33] + 6);
        auVar115 = pmaddwd(auVar103,auVar82);
        auVar108._8_8_ = auVar97._8_8_;
        auVar108._0_8_ = auVar107._8_8_;
        auVar117 = pmaddwd(auVar108,auVar61);
        auVar62._8_8_ = auVar92._0_8_;
        auVar62._0_8_ = auVar88._0_8_;
        auVar45 = pmaddwd(auVar62,auVar81);
        auVar89._8_8_ = auVar92._8_8_;
        auVar89._0_8_ = auVar88._8_8_;
        auVar106 = pmaddwd(auVar89,auVar87);
        iVar32 = auVar106._0_4_ + auVar45._0_4_ + auVar117._0_4_ + auVar115._0_4_;
        iVar33 = auVar106._4_4_ + auVar45._4_4_ + auVar117._4_4_ + auVar115._4_4_;
        iVar90 = auVar106._8_4_ + auVar45._8_4_ + auVar117._8_4_ + auVar115._8_4_;
        iVar91 = auVar106._12_4_ + auVar45._12_4_ + auVar117._12_4_ + auVar115._12_4_;
        if (conv_params->is_compound == 0) {
          auVar64._0_4_ = iVar42 + iVar38 >> auVar119;
          auVar64._4_4_ = iVar32 + iVar38 >> auVar119;
          auVar64._8_4_ = iVar55 + iVar38 >> auVar119;
          auVar64._12_4_ = iVar33 + iVar38 >> auVar119;
          auVar50._0_4_ = iVar57 + iVar38 >> auVar119;
          auVar50._4_4_ = iVar90 + iVar38 >> auVar119;
          auVar50._8_4_ = iVar58 + iVar38 >> auVar119;
          auVar50._12_4_ = iVar91 + iVar38 >> auVar119;
          auVar45 = packssdw(auVar64,auVar50);
          local_148 = auVar44._0_2_;
          sStack_146 = auVar44._2_2_;
          sVar60 = auVar45._0_2_;
          uVar59 = (ushort)(local_148 < sVar60) * local_148 | (ushort)(local_148 >= sVar60) * sVar60
          ;
          sVar60 = auVar45._2_2_;
          uVar68 = (ushort)(sStack_146 < sVar60) * sStack_146 |
                   (ushort)(sStack_146 >= sVar60) * sVar60;
          sVar60 = auVar45._4_2_;
          uVar69 = (ushort)(local_148 < sVar60) * local_148 | (ushort)(local_148 >= sVar60) * sVar60
          ;
          sVar60 = auVar45._6_2_;
          uVar70 = (ushort)(sStack_146 < sVar60) * sStack_146 |
                   (ushort)(sStack_146 >= sVar60) * sVar60;
          sVar60 = auVar45._8_2_;
          uVar71 = (ushort)(local_148 < sVar60) * local_148 | (ushort)(local_148 >= sVar60) * sVar60
          ;
          sVar60 = auVar45._10_2_;
          uVar72 = (ushort)(sStack_146 < sVar60) * sStack_146 |
                   (ushort)(sStack_146 >= sVar60) * sVar60;
          sVar60 = auVar45._12_2_;
          sVar75 = auVar45._14_2_;
          uVar73 = (ushort)(local_148 < sVar60) * local_148 | (ushort)(local_148 >= sVar60) * sVar60
          ;
          uVar74 = (ushort)(sStack_146 < sVar75) * sStack_146 |
                   (ushort)(sStack_146 >= sVar75) * sVar75;
          auVar65._0_8_ =
               CONCAT26((-1 < (short)uVar70) * uVar70,
                        CONCAT24((-1 < (short)uVar69) * uVar69,
                                 CONCAT22((-1 < (short)uVar68) * uVar68,
                                          (-1 < (short)uVar59) * uVar59)));
          auVar65._8_2_ = (-1 < (short)uVar71) * uVar71;
          auVar65._10_2_ = (-1 < (short)uVar72) * uVar72;
          auVar65._12_2_ = (-1 < (short)uVar73) * uVar73;
          auVar65._14_2_ = (-1 < (short)uVar74) * uVar74;
          if (p_width == 4) {
            *(undefined8 *)(pred + iVar25) = auVar65._0_8_;
          }
          else {
            *(undefined1 (*) [16])(pred + iVar25) = auVar65;
          }
        }
        else {
          auVar63._0_4_ = iVar42 + iVar39 >> auVar119;
          auVar63._4_4_ = iVar32 + iVar39 >> auVar119;
          auVar63._8_4_ = iVar55 + iVar39 >> auVar119;
          auVar63._12_4_ = iVar33 + iVar39 >> auVar119;
          puVar35 = conv_params->dst + (conv_params->dst_stride * iVar20 + iVar21);
          sVar60 = auVar43._0_2_;
          sVar75 = auVar43._2_2_;
          if (conv_params->do_average == 0) {
            auVar66 = packusdw(auVar63,auVar63);
          }
          else {
            auVar45 = pmovzxwd(auVar81,*(undefined8 *)puVar35);
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar32 = auVar63._0_4_ + auVar45._0_4_ >> 1;
              iVar33 = auVar63._4_4_ + auVar45._4_4_ >> 1;
              iVar42 = auVar63._8_4_ + auVar45._8_4_ >> 1;
              iVar55 = auVar63._12_4_ + auVar45._12_4_ >> 1;
            }
            else {
              auVar13._4_4_ = iVar6;
              auVar13._0_4_ = iVar6;
              auVar13._8_4_ = iVar6;
              auVar13._12_4_ = iVar6;
              auVar106 = pmulld(auVar45,auVar13);
              auVar11._4_4_ = iVar7;
              auVar11._0_4_ = iVar7;
              auVar11._8_4_ = iVar7;
              auVar11._12_4_ = iVar7;
              auVar45 = pmulld(auVar63,auVar11);
              iVar32 = auVar45._0_4_ + auVar106._0_4_ >> 4;
              iVar33 = auVar45._4_4_ + auVar106._4_4_ >> 4;
              iVar42 = auVar45._8_4_ + auVar106._8_4_ >> 4;
              iVar55 = auVar45._12_4_ + auVar106._12_4_ >> 4;
            }
            puVar35 = pred + iVar25;
            auVar67._0_4_ = iVar32 + iVar34 >> auVar118;
            auVar67._4_4_ = iVar33 + iVar34 >> auVar118;
            auVar67._8_4_ = iVar42 + iVar34 >> auVar118;
            auVar67._12_4_ = iVar55 + iVar34 >> auVar118;
            auVar45 = packusdw(auVar67,auVar67);
            sVar41 = auVar45._0_2_;
            auVar66._0_2_ = (ushort)(sVar60 < sVar41) * sVar60 | (ushort)(sVar60 >= sVar41) * sVar41
            ;
            sVar41 = auVar45._2_2_;
            auVar66._2_2_ = (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41
            ;
            sVar41 = auVar45._4_2_;
            auVar66._4_2_ = (ushort)(sVar60 < sVar41) * sVar60 | (ushort)(sVar60 >= sVar41) * sVar41
            ;
            sVar41 = auVar45._6_2_;
            auVar66._6_2_ = (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41
            ;
            sVar41 = auVar45._8_2_;
            auVar66._8_2_ = (ushort)(sVar60 < sVar41) * sVar60 | (ushort)(sVar60 >= sVar41) * sVar41
            ;
            sVar41 = auVar45._10_2_;
            auVar66._10_2_ =
                 (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41;
            sVar41 = auVar45._12_2_;
            sVar53 = auVar45._14_2_;
            auVar66._12_2_ =
                 (ushort)(sVar60 < sVar41) * sVar60 | (ushort)(sVar60 >= sVar41) * sVar41;
            auVar66._14_2_ =
                 (ushort)(sVar75 < sVar53) * sVar75 | (ushort)(sVar75 >= sVar53) * sVar53;
          }
          *(long *)puVar35 = auVar66._0_8_;
          if (4 < p_width) {
            lVar40 = (long)(conv_params->dst_stride * iVar20 + iVar21);
            auVar51._0_4_ = iVar57 + iVar39 >> auVar119;
            auVar51._4_4_ = iVar90 + iVar39 >> auVar119;
            auVar51._8_4_ = iVar58 + iVar39 >> auVar119;
            auVar51._12_4_ = iVar91 + iVar39 >> auVar119;
            if (conv_params->do_average == 0) {
              auVar45 = packusdw(auVar51,auVar51);
              *(long *)(conv_params->dst + lVar40 + 4) = auVar45._0_8_;
            }
            else {
              auVar45 = pmovzxwd(auVar66,*(undefined8 *)(conv_params->dst + lVar40 + 4));
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                iVar32 = auVar51._0_4_ + auVar45._0_4_ >> 1;
                iVar33 = auVar51._4_4_ + auVar45._4_4_ >> 1;
                iVar42 = auVar51._8_4_ + auVar45._8_4_ >> 1;
                iVar55 = auVar51._12_4_ + auVar45._12_4_ >> 1;
              }
              else {
                auVar14._4_4_ = iVar6;
                auVar14._0_4_ = iVar6;
                auVar14._8_4_ = iVar6;
                auVar14._12_4_ = iVar6;
                auVar106 = pmulld(auVar45,auVar14);
                auVar12._4_4_ = iVar7;
                auVar12._0_4_ = iVar7;
                auVar12._8_4_ = iVar7;
                auVar12._12_4_ = iVar7;
                auVar45 = pmulld(auVar51,auVar12);
                iVar32 = auVar45._0_4_ + auVar106._0_4_ >> 4;
                iVar33 = auVar45._4_4_ + auVar106._4_4_ >> 4;
                iVar42 = auVar45._8_4_ + auVar106._8_4_ >> 4;
                iVar55 = auVar45._12_4_ + auVar106._12_4_ >> 4;
              }
              auVar52._0_4_ = iVar32 + iVar34 >> auVar118;
              auVar52._4_4_ = iVar33 + iVar34 >> auVar118;
              auVar52._8_4_ = iVar42 + iVar34 >> auVar118;
              auVar52._12_4_ = iVar55 + iVar34 >> auVar118;
              auVar45 = packusdw(auVar52,auVar52);
              sVar41 = auVar45._0_2_;
              sVar53 = auVar45._2_2_;
              sVar54 = auVar45._4_2_;
              sVar56 = auVar45._6_2_;
              *(ulong *)(pred + (long)iVar25 + 4) =
                   CONCAT26((ushort)(sVar75 < sVar56) * sVar75 | (ushort)(sVar75 >= sVar56) * sVar56
                            ,CONCAT24((ushort)(sVar60 < sVar54) * sVar60 |
                                      (ushort)(sVar60 >= sVar54) * sVar54,
                                      CONCAT22((ushort)(sVar75 < sVar53) * sVar75 |
                                               (ushort)(sVar75 >= sVar53) * sVar53,
                                               (ushort)(sVar60 < sVar41) * sVar60 |
                                               (ushort)(sVar60 >= sVar41) * sVar41)));
            }
          }
        }
        iVar25 = iVar25 + p_stride;
        iVar20 = iVar20 + 1;
        palVar17 = palVar17 + 1;
        iVar28 = iVar28 + delta;
      }
      local_350 = local_350 + 8;
    }
    local_368 = local_368 + p_stride * 8;
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_sse4_1(const int32_t *mat, const uint16_t *ref,
                                   int width, int height, int stride,
                                   uint16_t *pred, int p_col, int p_row,
                                   int p_width, int p_height, int p_stride,
                                   int subsampling_x, int subsampling_y, int bd,
                                   ConvolveParams *conv_params, int16_t alpha,
                                   int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(!(bd == 12 && reduce_bits_horiz < 5));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const __m128i res_sub_const =
      _mm_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m128i round_bits_const = _mm_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;

        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          const __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          const __m128i src2 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

          const __m128i src_01 = _mm_shuffle_epi8(
              src, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));
          const __m128i src2_01 = _mm_shuffle_epi8(
              src2, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));

          __m128i src_lo = _mm_unpacklo_epi64(src_01, src2_01);
          __m128i src_hi = _mm_unpackhi_epi64(src_01, src2_01);

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_left);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_left);
          }

          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_right);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_right);
          }

          const __m128i src_padded = _mm_unpacklo_epi8(src_lo, src_hi);
          const __m128i src2_padded = _mm_unpackhi_epi8(src_lo, src_hi);

          highbd_horiz_filter(&src_padded, &src2_padded, tmp, sx, alpha, k,
                              offset_bits_horiz, reduce_bits_horiz);
        }
      } else {
        highbd_prepare_warp_horizontal_filter(
            ref, tmp, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
            offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      for (k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);

        // Load from tmp and rearrange pairs of consecutive rows into the
        // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
        const __m128i *src = tmp + (k + 4);
        const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
        const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
        const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
        const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

        // Filter even-index pixels
        const __m128i tmp_0 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_2 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_4 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_6 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
        const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
        const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
        const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

        const __m128i coeff_0 = _mm_unpacklo_epi64(tmp_8, tmp_10);
        const __m128i coeff_2 = _mm_unpackhi_epi64(tmp_8, tmp_10);
        const __m128i coeff_4 = _mm_unpacklo_epi64(tmp_12, tmp_14);
        const __m128i coeff_6 = _mm_unpackhi_epi64(tmp_12, tmp_14);

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_0);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_2);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_4);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_6);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
        const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
        const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
        const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

        const __m128i tmp_1 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_3 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_5 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_7 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
        const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
        const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
        const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

        const __m128i coeff_1 = _mm_unpacklo_epi64(tmp_9, tmp_11);
        const __m128i coeff_3 = _mm_unpackhi_epi64(tmp_9, tmp_11);
        const __m128i coeff_5 = _mm_unpacklo_epi64(tmp_13, tmp_15);
        const __m128i coeff_7 = _mm_unpackhi_epi64(tmp_13, tmp_15);

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_1);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_3);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_5);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_7);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];
          res_lo = _mm_add_epi32(res_lo, res_add_const);
          res_lo = _mm_sra_epi32(_mm_add_epi32(res_lo, reduce_bits_vert_const),
                                 reduce_bits_vert_shift);

          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m128i p_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              res_lo = _mm_add_epi32(_mm_mullo_epi32(p_32, wt0),
                                     _mm_mullo_epi32(res_lo, wt1));
              res_lo = _mm_srai_epi32(res_lo, DIST_PRECISION_BITS);
            } else {
              res_lo = _mm_srai_epi32(_mm_add_epi32(p_32, res_lo), 1);
            }

            __m128i res32_lo = _mm_add_epi32(res_lo, res_sub_const);
            res32_lo = _mm_sra_epi32(_mm_add_epi32(res32_lo, round_bits_const),
                                     round_bits_shift);

            __m128i res16_lo = _mm_packus_epi32(res32_lo, res32_lo);
            res16_lo = _mm_min_epi16(res16_lo, clip_pixel);
            _mm_storel_epi64(dst16, res16_lo);
          } else {
            res_lo = _mm_packus_epi32(res_lo, res_lo);
            _mm_storel_epi64(p, res_lo);
          }
          if (p_width > 4) {
            __m128i *const p4 =
                (__m128i *)&conv_params
                    ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];

            res_hi = _mm_add_epi32(res_hi, res_add_const);
            res_hi =
                _mm_sra_epi32(_mm_add_epi32(res_hi, reduce_bits_vert_const),
                              reduce_bits_vert_shift);
            if (conv_params->do_average) {
              __m128i *const dst16_4 =
                  (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
              __m128i p4_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p4));

              if (conv_params->use_dist_wtd_comp_avg) {
                res_hi = _mm_add_epi32(_mm_mullo_epi32(p4_32, wt0),
                                       _mm_mullo_epi32(res_hi, wt1));
                res_hi = _mm_srai_epi32(res_hi, DIST_PRECISION_BITS);
              } else {
                res_hi = _mm_srai_epi32(_mm_add_epi32(p4_32, res_hi), 1);
              }

              __m128i res32_hi = _mm_add_epi32(res_hi, res_sub_const);
              res32_hi = _mm_sra_epi32(
                  _mm_add_epi32(res32_hi, round_bits_const), round_bits_shift);
              __m128i res16_hi = _mm_packus_epi32(res32_hi, res32_hi);
              res16_hi = _mm_min_epi16(res16_hi, clip_pixel);
              _mm_storel_epi64(dst16_4, res16_hi);
            } else {
              res_hi = _mm_packus_epi32(res_hi, res_hi);
              _mm_storel_epi64(p4, res_hi);
            }
          }
        } else {
          // Round and pack into 8 bits
          const __m128i round_const =
              _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                             ((1 << reduce_bits_vert) >> 1));

          const __m128i res_lo_round = _mm_srai_epi32(
              _mm_add_epi32(res_lo, round_const), reduce_bits_vert);
          const __m128i res_hi_round = _mm_srai_epi32(
              _mm_add_epi32(res_hi, round_const), reduce_bits_vert);

          __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m128i max_val = _mm_set1_epi16((1 << bd) - 1);
          const __m128i zero = _mm_setzero_si128();
          res_16bit = _mm_max_epi16(_mm_min_epi16(res_16bit, max_val), zero);

          // Store, blending with 'pred' if needed
          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          // Note: If we're outputting a 4x4 block, we need to be very careful
          // to only output 4 pixels at this point, to avoid encode/decode
          // mismatches when encoding with multiple threads.
          if (p_width == 4) {
            _mm_storel_epi64(p, res_16bit);
          } else {
            _mm_storeu_si128(p, res_16bit);
          }
        }
      }
    }
  }
}